

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMS_ECC_PARMS_Marshal(TPMS_ECC_PARMS *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  UINT16 UVar4;
  UINT16 result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_ECC_PARMS *source_local;
  
  UVar1 = TPMT_SYM_DEF_OBJECT_Marshal(&source->symmetric,buffer,size);
  UVar2 = TPMT_ECC_SCHEME_Marshal(&source->scheme,buffer,size);
  UVar3 = UINT16_Marshal(&source->curveID,buffer,size);
  UVar4 = TPMT_KDF_SCHEME_Marshal(&source->kdf,buffer,size);
  return UVar1 + UVar2 + UVar3 + UVar4;
}

Assistant:

UINT16
TPMS_ECC_PARMS_Marshal(TPMS_ECC_PARMS *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPMT_SYM_DEF_OBJECT_Marshal((TPMT_SYM_DEF_OBJECT *)&(source->symmetric), buffer, size));
    result = (UINT16)(result + TPMT_ECC_SCHEME_Marshal((TPMT_ECC_SCHEME *)&(source->scheme), buffer, size));
    result = (UINT16)(result + TPMI_ECC_CURVE_Marshal((TPMI_ECC_CURVE *)&(source->curveID), buffer, size));
    result = (UINT16)(result + TPMT_KDF_SCHEME_Marshal((TPMT_KDF_SCHEME *)&(source->kdf), buffer, size));
    return result;
}